

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

S1Interval __thiscall S1Interval::Expanded(S1Interval *this,double margin)

{
  double dVar1;
  double dVar2;
  S1Interval SVar3;
  S1Interval local_18;
  
  dVar2 = (this->bounds_).c_[0];
  dVar1 = (this->bounds_).c_[1];
  if (0.0 <= margin) {
    if ((((dVar2 == 3.141592653589793) && (!NAN(dVar2))) && (dVar1 == -3.141592653589793)) &&
       (!NAN(dVar1))) goto LAB_001e5209;
    dVar1 = GetLength(this);
    if (6.283185307179586 <= margin + margin + dVar1 + 4.440892098500626e-16) {
      SVar3 = Full();
      return (Vector2_d)SVar3.bounds_.c_;
    }
  }
  else {
    if (((dVar2 == -3.141592653589793) && (!NAN(dVar2))) &&
       ((dVar1 == 3.141592653589793 && (!NAN(dVar1))))) {
LAB_001e5209:
      return (S1Interval)(Vector2_d)*&(this->bounds_).c_;
    }
    dVar1 = GetLength(this);
    if (margin + margin + dVar1 + -4.440892098500626e-16 <= 0.0) {
      local_18.bounds_.c_[1] = -3.141592653589793;
      local_18.bounds_.c_[0] = 3.141592653589793;
      return (Vector2_d)local_18.bounds_.c_;
    }
  }
  dVar2 = remainder(dVar2 - margin,6.283185307179586);
  dVar1 = remainder(margin + (this->bounds_).c_[1],6.283185307179586);
  S1Interval(&local_18,dVar2,dVar1);
  if (local_18.bounds_.c_[0] <= -3.141592653589793) {
    set_lo(&local_18,3.141592653589793);
  }
  return (Vector2_d)(Vector2_d)local_18;
}

Assistant:

S1Interval S1Interval::Expanded(double margin) const {
  if (margin >= 0) {
    if (is_empty()) return *this;
    // Check whether this interval will be full after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin + 2 * DBL_EPSILON >= 2 * M_PI) return Full();
  } else {
    if (is_full()) return *this;
    // Check whether this interval will be empty after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin - 2 * DBL_EPSILON <= 0) return Empty();
  }
  S1Interval result(remainder(lo() - margin, 2*M_PI),
                    remainder(hi() + margin, 2*M_PI));
  if (result.lo() <= -M_PI) result.set_lo(M_PI);
  return result;
}